

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O2

int Potassco::xconvert<Clasp::Cli::ConfigKey,unsigned_int>
              (char *x,pair<Clasp::Cli::ConfigKey,_unsigned_int> *out,char **errPos,int sep)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char *n;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> temp;
  ulong local_38;
  
  if (x == (char *)0x0) {
    return 0;
  }
  iVar3 = 0x2c;
  if (sep != 0) {
    iVar3 = sep;
  }
  temp = *out;
  cVar1 = *x;
  n = x;
  if (cVar1 == '(') {
    n = x + 1;
  }
  local_38 = (ulong)(cVar1 == '(');
  iVar2 = Clasp::Cli::xconvert(n,&temp.first,&n,sep);
  bVar5 = true;
  if (((iVar2 != 0) && ((char)iVar3 == *n)) && (n[1] != '\0')) {
    iVar3 = xconvert(n + 1,&temp.second,&n,iVar3);
    bVar5 = iVar3 == 0;
  }
  if ((cVar1 == '(') && (*n != ')')) {
LAB_001289da:
    iVar3 = 0;
    pcVar4 = x;
  }
  else {
    pcVar4 = n + local_38;
    if (bVar5) {
      if (*pcVar4 != '\0') goto LAB_001289da;
      iVar3 = 1;
    }
    else {
      out->second = temp.second;
      iVar3 = 2;
    }
    out->first = temp.first;
  }
  if (errPos != (char **)0x0) {
    *errPos = pcVar4;
  }
  return iVar3;
}

Assistant:

int xconvert(const char* x, std::pair<T, U>& out, const char** errPos = 0, int sep = def_sep) {
	if (!x) { return 0; }
	if (sep == 0) { sep = def_sep; }
	std::pair<T, U> temp(out);
	const char* n = x;
	int ps = 0;
	if (*n == '(') { ++ps; ++n; }
	int tokT = xconvert(n, temp.first, &n, sep);
	int tokU = tokT && *n == (char)sep && n[1] ? xconvert(n+1, temp.second, &n, sep) : 0;
	int sum  = 0;
	if (!ps || *n == ')') {
		n += ps;
		if (tokU)        { out.second= temp.second; ++sum; }
		if (tokU || !*n) { out.first = temp.first; ++sum; }
	}
	if (!sum) { n = x; }
	if (errPos) *errPos = n;
	return sum;
}